

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Speedup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  void *local_58;
  uint local_48;
  int fVeryVerbose;
  int c;
  int fVerbose;
  int Degree;
  int Percentage;
  int fUseLutLib;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  fVerbose = 5;
  c = 2;
  fVeryVerbose = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"PNlvwh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Speedup(): There is no AIG to map.\n");
        return 1;
      }
      iVar2 = Gia_ManHasMapping(pAbc->pGia);
      if (iVar2 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n");
        return 1;
      }
      if (bVar1) {
        local_58 = pAbc->pLibLut;
      }
      else {
        local_58 = (void *)0x0;
      }
      pAbc->pGia->pLutLib = local_58;
      pNew = Gia_ManSpeedup(pAbc->pGia,fVerbose,c,fVeryVerbose,local_48);
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    switch(iVar2) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
LAB_002b7f38:
        Abc_Print(-2,"usage: &speedup [-P num] [-N num] [-lvwh]\n");
        Abc_Print(-2,"\t           transforms LUT-mapped network into an AIG with choices;\n");
        Abc_Print(-2,"\t           the choices are added to speedup the next round of mapping\n");
        Abc_Print(-2,
                  "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n"
                  ,(ulong)(uint)fVerbose);
        Abc_Print(-2,
                  "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n"
                  ,(ulong)(uint)c);
        pcVar3 = "unit";
        if (bVar1) {
          pcVar3 = "lib";
        }
        Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (fVeryVerbose != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_48 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                  pcVar3);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((c < 1) || (5 < c)) goto LAB_002b7f38;
      break;
    default:
      goto LAB_002b7f38;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002b7f38;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((fVerbose < 1) || (100 < fVerbose)) goto LAB_002b7f38;
      break;
    case 0x68:
      goto LAB_002b7f38;
    case 0x6c:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      fVeryVerbose = fVeryVerbose ^ 1;
      break;
    case 0x77:
      local_48 = local_48 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Speedup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int fUseLutLib;
    int Percentage;
    int Degree;
    int fVerbose;
    int c, fVeryVerbose;

    // set defaults
    fUseLutLib   = 0;
    Percentage   = 5;
    Degree       = 2;
    fVerbose     = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PNlvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            Percentage = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Percentage < 1 || Percentage > 100 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            Degree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Degree < 1 || Degree > 5 )
                goto usage;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): There is no AIG to map.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pAbc->pGia->pLutLib = fUseLutLib ? pAbc->pLibLut : NULL;
    pTemp = Gia_ManSpeedup( pAbc->pGia, Percentage, Degree, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &speedup [-P num] [-N num] [-lvwh]\n" );
    Abc_Print( -2, "\t           transforms LUT-mapped network into an AIG with choices;\n" );
    Abc_Print( -2, "\t           the choices are added to speedup the next round of mapping\n" );
    Abc_Print( -2, "\t-P <num> : delay delta defining critical path for library model [default = %d%%]\n", Percentage );
    Abc_Print( -2, "\t-N <num> : the max critical path degree for resynthesis (0 < num < 6) [default = %d]\n", Degree );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib" : "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}